

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void V_SetAllCmp(Vector *V,Real Val)

{
  ulong uVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  ulong uVar4;
  
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    uVar1 = V->Dim;
    if (uVar1 != 0) {
      pRVar2 = V->Cmp;
      uVar4 = 1;
      do {
        pRVar2[uVar4] = Val;
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetAllCmp(Vector *V, Real Val)
/* set all vector components equal Val */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        for(Ind = 1; Ind <= Dim; Ind++)
            VCmp[Ind] = Val;
        V->Multipl = 1.0;
    }
}